

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::set_seed(torrent *this,torrent_peer *p,bool s)

{
  pointer this_00;
  bool s_local;
  torrent_peer *p_local;
  torrent *this_local;
  
  if (((*(uint *)&p->field_0x1b >> 7 & 1) != 0) != s) {
    if (s) {
      this->m_num_seeds = this->m_num_seeds + 1;
    }
    else {
      this->m_num_seeds = this->m_num_seeds - 1;
    }
    need_peer_list(this);
    this_00 = ::std::
              unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    peer_list::set_seed(this_00,p,s);
    update_auto_sequential(this);
  }
  return;
}

Assistant:

void torrent::set_seed(torrent_peer* p, bool const s)
	{
		if (bool(p->seed) == s) return;
		if (s)
		{
			TORRENT_ASSERT(m_num_seeds < 0xffff);
			++m_num_seeds;
		}
		else
		{
			TORRENT_ASSERT(m_num_seeds > 0);
			--m_num_seeds;
		}

		need_peer_list();
		m_peer_list->set_seed(p, s);
		update_auto_sequential();
	}